

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrCMP0xcd(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  uint8_t reg;
  
  reg = in_RDI->A;
  argument = absolute_addr((CPU *)CONCAT17(reg,in_stack_fffffffffffffff0));
  CMP(in_RDI,reg,argument);
  return 4;
}

Assistant:

int CPU::instrCMP0xcd() {
	CMP(A, absolute_addr());
	return 4;
}